

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreRenderTarget.h
# Opt level: O3

void __thiscall
irr::video::
COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::COpenGLCoreRenderTarget
          (COpenGLCoreRenderTarget<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
           *this,COpenGLDriver *driver)

{
  void *__s;
  E_DRIVER_TYPE EVar1;
  int iVar2;
  undefined4 extraout_var;
  COpenGLCoreFeature *pCVar3;
  code *pcVar4;
  ulong uVar5;
  size_type __new_size;
  
  __new_size = 0;
  *(undefined8 *)&this->field_0xa0 = 0;
  *(undefined4 *)&this->field_0xa8 = 1;
  (this->super_IRenderTarget).Textures.m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IRenderTarget).Textures.m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IRenderTarget).Textures.m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_IRenderTarget).Textures.is_sorted = true;
  (this->super_IRenderTarget).DepthStencil = (ITexture *)0x0;
  (this->super_IRenderTarget).CubeSurfaces.m_data.
  super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_IRenderTarget).CubeSurfaces.m_data.
  super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_IRenderTarget).CubeSurfaces.m_data.
  super__Vector_base<irr::video::E_CUBE_SURFACE,_std::allocator<irr::video::E_CUBE_SURFACE>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_IRenderTarget).CubeSurfaces.is_sorted = true;
  (this->super_IRenderTarget).DriverType = EDT_NULL;
  (this->super_IRenderTarget)._vptr_IRenderTarget = (_func_int **)0x264fc0;
  *(undefined8 *)&this->field_0x98 = 0x264ff0;
  *(undefined8 *)&(this->super_IRenderTarget).field_0x58 = 0;
  *(undefined8 *)&(this->super_IRenderTarget).field_0x60 = 0;
  *(undefined8 *)&(this->super_IRenderTarget).field_0x68 = 0;
  this->field_0x70 = 1;
  this->AssignedDepth = false;
  this->AssignedStencil = false;
  this->RequestTextureUpdate = false;
  this->RequestDepthStencilUpdate = false;
  this->BufferID = 0;
  (this->Size).Width = 0;
  (this->Size).Height = 0;
  this->ColorAttachment = 0;
  this->MultipleRenderTarget = 0;
  this->Driver = driver;
  EVar1 = (*(driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x54])(driver);
  (this->super_IRenderTarget).DriverType = EVar1;
  iVar2 = (*(this->Driver->super_CNullDriver).super_IVideoDriver._vptr_IVideoDriver[0x3b])();
  this->Size = *(dimension2d<unsigned_int> *)CONCAT44(extraout_var,iVar2);
  pCVar3 = COpenGLExtensionHandler::getFeature
                     ((COpenGLExtensionHandler *)&(this->Driver->super_CNullDriver).field_0x498);
  this->ColorAttachment = (uint)pCVar3->ColorAttachment;
  pCVar3 = COpenGLExtensionHandler::getFeature
                     ((COpenGLExtensionHandler *)&(this->Driver->super_CNullDriver).field_0x498);
  this->MultipleRenderTarget = (uint)pCVar3->MultipleRenderTarget;
  if (this->ColorAttachment != 0) {
    this->BufferID = 0;
    pcVar4 = *(code **)&this->Driver->field_0x908;
    if (pcVar4 == (code *)0x0) {
      pcVar4 = *(code **)&this->Driver->field_0x960;
      __new_size = (size_type)this->ColorAttachment;
      if (pcVar4 == (code *)0x0) goto LAB_001e6393;
    }
    (*pcVar4)(1,&this->BufferID);
    __new_size = (size_type)this->ColorAttachment;
  }
LAB_001e6393:
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &(this->super_IRenderTarget).field_0x58,__new_size);
  __s = *(void **)&(this->super_IRenderTarget).field_0x58;
  uVar5 = *(long *)&(this->super_IRenderTarget).field_0x60 - (long)__s;
  if ((uVar5 & 0x3fffffffc) != 0) {
    memset(__s,0,uVar5 & 0x3fffffffc);
    return;
  }
  return;
}

Assistant:

COpenGLCoreRenderTarget(TOpenGLDriver *driver) :
			AssignedDepth(false), AssignedStencil(false), RequestTextureUpdate(false), RequestDepthStencilUpdate(false),
			BufferID(0), ColorAttachment(0), MultipleRenderTarget(0), Driver(driver)
	{
#ifdef _DEBUG
		setDebugName("COpenGLCoreRenderTarget");
#endif

		DriverType = Driver->getDriverType();

		Size = Driver->getScreenSize();

		ColorAttachment = Driver->getFeature().ColorAttachment;
		MultipleRenderTarget = Driver->getFeature().MultipleRenderTarget;

		if (ColorAttachment > 0)
			Driver->irrGlGenFramebuffers(1, &BufferID);

		AssignedTextures.set_used(static_cast<u32>(ColorAttachment));

		for (u32 i = 0; i < AssignedTextures.size(); ++i)
			AssignedTextures[i] = GL_NONE;
	}